

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLine.cpp
# Opt level: O0

uint __thiscall llvm::cl::generic_parser_base::findOption(generic_parser_base *this,StringRef Name)

{
  uint uVar1;
  int iVar2;
  undefined4 extraout_var;
  size_t __n;
  size_t extraout_RDX;
  char *__s2;
  bool bVar3;
  uint local_98;
  uint i;
  uint e;
  generic_parser_base *this_local;
  StringRef Name_local;
  void *local_50 [2];
  void **local_40;
  char *local_38;
  size_t local_30;
  size_t local_28;
  char *local_20;
  void *local_18;
  int local_c;
  
  __n = Name.Length;
  __s2 = Name.Data;
  uVar1 = (*this->_vptr_generic_parser_base[2])();
  local_98 = 0;
  while( true ) {
    if (local_98 == uVar1) {
      return uVar1;
    }
    iVar2 = (*this->_vptr_generic_parser_base[3])(this,(ulong)local_98);
    local_50[0] = (void *)CONCAT44(extraout_var,iVar2);
    local_40 = local_50;
    bVar3 = false;
    local_38 = __s2;
    local_30 = __n;
    if (extraout_RDX == __n) {
      local_28 = __n;
      local_20 = __s2;
      local_18 = local_50[0];
      if (__n == 0) {
        local_c = 0;
      }
      else {
        local_c = memcmp(local_50[0],__s2,__n);
      }
      bVar3 = local_c == 0;
    }
    if (bVar3) break;
    local_98 = local_98 + 1;
  }
  return local_98;
}

Assistant:

unsigned generic_parser_base::findOption(StringRef Name) {
  unsigned e = getNumOptions();

  for (unsigned i = 0; i != e; ++i) {
    if (getOption(i) == Name)
      return i;
  }
  return e;
}